

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall libcellml::Parser::Parser(Parser *this)

{
  ParserImpl *pPVar1;
  Parser *this_local;
  
  pPVar1 = (ParserImpl *)operator_new(0x70);
  pPVar1->mParser = (Parser *)0x0;
  pPVar1->mParsing1XVersion = false;
  pPVar1->mParsing20Version = false;
  *(undefined6 *)&pPVar1->field_0x6a = 0;
  (pPVar1->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mErrors.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mErrors.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pPVar1->super_LoggerImpl).mErrors.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ParserImpl::ParserImpl(pPVar1);
  Logger::Logger(&this->super_Logger,(LoggerImpl *)pPVar1);
  Strict::Strict(&this->super_Strict);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Parser_0046a160;
  (this->super_Strict)._vptr_Strict = (_func_int **)&DAT_0046a180;
  pPVar1 = pFunc(this);
  pPVar1->mParser = this;
  Strict::setStrict(&this->super_Strict,true);
  return;
}

Assistant:

Parser::Parser()
    : Logger(new ParserImpl())
{
    pFunc()->mParser = this;
    setStrict(true);
}